

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void SBarInfo::Load(void)

{
  bool bVar1;
  int iVar2;
  SBarInfo *pSVar3;
  int local_20;
  int lump_1;
  int lastlump;
  int local_c;
  int lump;
  
  FreeSBarInfoScript();
  TArray<FMugShotState,_FMugShotState>::Clear(&MugShotStates);
  bVar1 = FString::IsNotEmpty(&gameinfo.statusbar);
  if ((bVar1) &&
     (local_c = FWadCollection::CheckNumForFullName(&Wads,&gameinfo.statusbar,true,0), local_c != -1
     )) {
    if ((batchrun & 1U) == 0) {
      Printf("ParseSBarInfo: Loading default status bar definition.\n");
    }
    if (SBarInfoScript[1] == (SBarInfo *)0x0) {
      pSVar3 = (SBarInfo *)operator_new(0x160);
      SBarInfo(pSVar3,local_c);
      SBarInfoScript[1] = pSVar3;
    }
    else {
      ParseSBarInfo(SBarInfoScript[1],local_c);
    }
  }
  iVar2 = FWadCollection::CheckNumForName(&Wads,"SBARINFO");
  if (iVar2 != -1) {
    if ((batchrun & 1U) == 0) {
      Printf("ParseSBarInfo: Loading custom status bar definition.\n");
    }
    local_20 = 0;
    while (iVar2 = FWadCollection::FindLump(&Wads,"SBARINFO",&local_20,false), iVar2 != -1) {
      if (SBarInfoScript[0] == (SBarInfo *)0x0) {
        pSVar3 = (SBarInfo *)operator_new(0x160);
        SBarInfo(pSVar3,iVar2);
        SBarInfoScript[0] = pSVar3;
      }
      else {
        ParseSBarInfo(SBarInfoScript[0],iVar2);
      }
    }
  }
  addterm(FreeSBarInfoScript,"FreeSBarInfoScript");
  return;
}

Assistant:

void SBarInfo::Load()
{
	FreeSBarInfoScript();
	MugShotStates.Clear();
	if(gameinfo.statusbar.IsNotEmpty())
	{
		int lump = Wads.CheckNumForFullName(gameinfo.statusbar, true);
		if(lump != -1)
		{
			if (!batchrun) Printf ("ParseSBarInfo: Loading default status bar definition.\n");
			if(SBarInfoScript[SCRIPT_DEFAULT] == NULL)
				SBarInfoScript[SCRIPT_DEFAULT] = new SBarInfo(lump);
			else
				SBarInfoScript[SCRIPT_DEFAULT]->ParseSBarInfo(lump);
		}
	}

	if(Wads.CheckNumForName("SBARINFO") != -1)
	{
		if (!batchrun) Printf ("ParseSBarInfo: Loading custom status bar definition.\n");
		int lastlump, lump;
		lastlump = 0;
		while((lump = Wads.FindLump("SBARINFO", &lastlump)) != -1)
		{
			if(SBarInfoScript[SCRIPT_CUSTOM] == NULL)
				SBarInfoScript[SCRIPT_CUSTOM] = new SBarInfo(lump);
			else //We now have to load multiple SBarInfo Lumps so the 2nd time we need to use this method instead.
				SBarInfoScript[SCRIPT_CUSTOM]->ParseSBarInfo(lump);
		}
	}
	atterm(FreeSBarInfoScript);
}